

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O0

void Cloud_Quit(CloudManager *dd)

{
  int local_14;
  int i;
  CloudManager *dd_local;
  
  if (dd->ppNodes != (CloudNode **)0x0) {
    free(dd->ppNodes);
    dd->ppNodes = (CloudNode **)0x0;
  }
  if (dd->tUnique != (CloudNode *)0x0) {
    free(dd->tUnique);
    dd->tUnique = (CloudNode *)0x0;
  }
  if (dd->vars != (CloudNode **)0x0) {
    free(dd->vars);
    dd->vars = (CloudNode **)0x0;
  }
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    if (dd->tCaches[local_14] != (CloudCacheEntry2 *)0x0) {
      free(dd->tCaches[local_14]);
      dd->tCaches[local_14] = (CloudCacheEntry2 *)0x0;
    }
  }
  if (dd != (CloudManager *)0x0) {
    free(dd);
  }
  return;
}

Assistant:

void Cloud_Quit( CloudManager * dd )
{
    int i;
    ABC_FREE( dd->ppNodes );
    ABC_FREE( dd->tUnique ); 
    ABC_FREE( dd->vars ); 
    for ( i = 0; i < 4; i++ )
        ABC_FREE( dd->tCaches[i] );
    ABC_FREE( dd ); 
}